

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(longlong lhs,
         SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  bool bVar2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RSI;
  longlong in_RDI;
  longlong ret;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  longlong *in_stack_ffffffffffffffb8;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffc0;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> u;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffe0;
  longlong *local_8;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xffffffffffffffe0);
  u.m_int = in_RSI.m_int;
  bVar2 = DivisionCornerCaseHelper<unsigned_long_long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    (in_RDI,in_RSI,
                     (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                      *)&stack0xffffffffffffffe0);
  SVar1.m_int = in_stack_ffffffffffffffe0.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<unsigned_long_long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2
                        (in_RDI,in_RSI,
                         (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&stack0xffffffffffffffe0), SVar1.m_int = in_stack_ffffffffffffffe0.m_int
     , !bVar2)) {
    this = (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffffc0);
    DivisionHelper<long_long,_unsigned_long_long,_3>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((longlong *)in_stack_ffffffffffffffe0.m_int,(uint64_t *)u.m_int,
               (longlong *)in_RSI.m_int);
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<long_long>(this,in_stack_ffffffffffffffb8);
    SVar1.m_int = (unsigned_long_long)local_8;
  }
  local_8 = (longlong *)SVar1.m_int;
  return (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         (unsigned_long_long)local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}